

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManComputeCuts(Nf_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  int v;
  uint uVar2;
  float Entry;
  
  v = 0;
  while( true ) {
    if (p->pGia->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
      iVar1 = Gia_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        Nf_ObjMergeOrder(p,v);
      }
      else {
        iVar1 = v - (uVar2 & 0x1fffffff);
        Entry = Vec_FltEntry(&p->vCutFlows,iVar1);
        Vec_FltWriteEntry(&p->vCutFlows,v,Entry);
        iVar1 = Vec_IntEntry(&p->vCutDelays,iVar1);
        Vec_IntWriteEntry(&p->vCutDelays,v,iVar1);
      }
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Nf_ManComputeCuts( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Nf_ObjSetCutFlow( p, i,  Nf_ObjCutFlow(p, iFanin) );
            Nf_ObjSetCutDelay( p, i, Nf_ObjCutDelay(p, iFanin) );
        }
        else
            Nf_ObjMergeOrder( p, i );
}